

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

string * license::guess_templates_folder(string *__return_storage_ptr__,string *source_folder)

{
  bool bVar1;
  runtime_error *prVar2;
  string *psVar3;
  path *p;
  undefined1 local_238 [8];
  path normalized;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  path local_170;
  undefined1 local_150 [8];
  path template_fname2;
  path local_110;
  path local_f0;
  undefined1 local_d0 [8];
  path template_fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  path templates_path;
  string *source_folder_local;
  
  templates_path.m_pathname.field_2._8_8_ = source_folder;
  boost::filesystem::path::path((path *)local_38,source_folder);
  bVar1 = boost::filesystem::exists((path *)local_38);
  if ((!bVar1) || (bVar1 = boost::filesystem::is_directory((path *)local_38), !bVar1)) {
    template_fname.m_pathname.field_2._M_local_buf[0xe] = '\x01';
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a8,"Templates directory [",
               (allocator *)(template_fname.m_pathname.field_2._M_local_buf + 0xf));
    psVar3 = boost::filesystem::path::string_abi_cxx11_((path *)local_38);
    std::operator+(&local_88,&local_a8,psVar3);
    std::operator+(&local_68,&local_88,"] does not exist or is not a directory");
    std::runtime_error::runtime_error(prVar2,(string *)&local_68);
    template_fname.m_pathname.field_2._M_local_buf[0xe] = '\0';
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  boost::filesystem::path::path(&local_f0,"public_key.inja");
  boost::filesystem::operator/((path *)local_d0,(path *)local_38,&local_f0);
  boost::filesystem::path::~path(&local_f0);
  bVar1 = boost::filesystem::exists((path *)local_d0);
  if ((!bVar1) || (bVar1 = boost::filesystem::is_regular_file((path *)local_d0), !bVar1)) {
    boost::filesystem::path::path
              ((path *)((long)&template_fname2.m_pathname.field_2 + 8),"templates");
    boost::filesystem::operator/
              (&local_110,(path *)local_38,(path *)((long)&template_fname2.m_pathname.field_2 + 8));
    boost::filesystem::path::operator=((path *)local_38,&local_110);
    boost::filesystem::path::~path(&local_110);
    boost::filesystem::path::~path((path *)((long)&template_fname2.m_pathname.field_2 + 8));
    boost::filesystem::path::path(&local_170,"public_key.inja");
    boost::filesystem::operator/((path *)local_150,(path *)local_38,&local_170);
    boost::filesystem::path::~path(&local_170);
    bVar1 = boost::filesystem::exists((path *)local_150);
    if ((!bVar1) || (bVar1 = boost::filesystem::is_regular_file((path *)local_150), !bVar1)) {
      normalized.m_pathname.field_2._M_local_buf[0xe] = '\x01';
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_210,"Templates file [",
                 (allocator *)(normalized.m_pathname.field_2._M_local_buf + 0xf));
      psVar3 = boost::filesystem::path::string_abi_cxx11_((path *)local_150);
      std::operator+(&local_1f0,&local_210,psVar3);
      std::operator+(&local_1d0,&local_1f0,"] does not exist. tried also [");
      psVar3 = boost::filesystem::path::string_abi_cxx11_((path *)local_d0);
      std::operator+(&local_1b0,&local_1d0,psVar3);
      std::operator+(&local_190,&local_1b0,"]");
      std::runtime_error::runtime_error(prVar2,(string *)&local_190);
      normalized.m_pathname.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    boost::filesystem::path::~path((path *)local_150);
  }
  p = boost::filesystem::path::normalize((path *)local_38);
  boost::filesystem::path::path((path *)local_238,p);
  psVar3 = boost::filesystem::path::string_abi_cxx11_((path *)local_238);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  boost::filesystem::path::~path((path *)local_238);
  boost::filesystem::path::~path((path *)local_d0);
  boost::filesystem::path::~path((path *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static const string guess_templates_folder(const string &source_folder) {
	fs::path templates_path(source_folder);
	if (!fs::exists(templates_path) || !fs::is_directory(templates_path)) {
		throw std::runtime_error(string("Templates directory [") + templates_path.string() +
								 "] does not exist or is not a directory");
	}
	fs::path template_fname(templates_path / TEMPLATE);
	if (!fs::exists(template_fname) || !fs::is_regular_file(template_fname)) {
		// try to add a /templates
		templates_path = templates_path / "templates";
		fs::path template_fname2(templates_path / TEMPLATE);
		if (!fs::exists(template_fname2) || !fs::is_regular_file(template_fname2)) {
			throw std::runtime_error(string("Templates file [") + template_fname2.string() +
									 "] does not exist. tried also [" + template_fname.string() + "]");
		}
	}
	fs::path normalized = templates_path.normalize();
	return normalized.string();
}